

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_busyindicator.cpp
# Opt level: O3

void QtMWidgets::BusyIndicator::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  QColor *pQVar5;
  
  if (_c == WriteProperty) {
    pQVar5 = (QColor *)*_a;
    if (_id == 2) {
      setRadius((BusyIndicator *)_o,pQVar5->cspec);
      return;
    }
    if (_id == 1) {
      setColor((BusyIndicator *)_o,pQVar5);
      return;
    }
    if (_id == 0) {
      setRunning((BusyIndicator *)_o,SUB41(pQVar5->cspec,0));
      return;
    }
  }
  else if (_c == ReadProperty) {
    piVar1 = (int *)*_a;
    if (_id == 2) {
      iVar4 = radius((BusyIndicator *)_o);
      *piVar1 = iVar4;
    }
    else if (_id == 1) {
      pQVar5 = color((BusyIndicator *)_o);
      uVar2 = *(undefined8 *)((long)&pQVar5->ct + 2);
      *(undefined8 *)piVar1 = *(undefined8 *)pQVar5;
      *(undefined8 *)((long)piVar1 + 6) = uVar2;
    }
    else if (_id == 0) {
      bVar3 = isRunning((BusyIndicator *)_o);
      *(bool *)piVar1 = bVar3;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    _q_update((BusyIndicator *)_o,(QVariant *)_a[1]);
    return;
  }
  return;
}

Assistant:

void QtMWidgets::BusyIndicator::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<BusyIndicator *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->_q_update((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<BusyIndicator *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->isRunning(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->radius(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<BusyIndicator *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRunning(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setRadius(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}